

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::extAddPairwiseToUI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Type *other;
  Literal *in_RDX;
  long lVar1;
  Literal *this_00;
  undefined1 local_280 [8];
  LaneArray<8_*_2> lanes;
  LaneArray<8> result;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_280,(wasm *)this,in_RDX);
  lVar1 = 0;
  memset(&lanes._M_elems[0xf].type,0,0xc0);
  other = &result._M_elems[7].type;
  do {
    if ((*(long *)((long)&lanes._M_elems[0].field_0 + lVar1 * 2 + 8) != 2) ||
       (*(long *)((long)&lanes._M_elems[1].field_0 + lVar1 * 2 + 8) != 2)) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    result._M_elems[7].type.id._0_4_ =
         (uint)*(byte *)((long)&lanes._M_elems[0].type.id + lVar1 * 2) +
         (uint)(byte)local_280[lVar1 * 2];
    this_00 = (Literal *)((long)result._M_elems + lVar1 + -8);
    if (this_00 != (Literal *)other) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)other);
    }
    ~Literal((Literal *)other);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(__return_storage_ptr__,(LaneArray<8> *)&lanes._M_elems[0xf].type);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)((long)result._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x168;
  do {
    ~Literal((Literal *)(local_280 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extAddPairwiseToUI16x8() const {
  return extAddPairwise<8, uint8_t, int16_t>(*this);
}